

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmGen9ResourceULT.cpp
# Opt level: O1

void __thiscall
CTestGen9Resource_Test1DLinearResource_Test::TestBody
          (CTestGen9Resource_Test1DLinearResource_Test *this)

{
  CTestGen9Resource_Test1DLinearResource_Test *pCVar1;
  undefined4 uVar2;
  uint uVar3;
  GMM_RESOURCE_INFO *pGVar4;
  undefined4 *puVar5;
  int iVar6;
  undefined8 *puVar7;
  uint32_t i;
  uint uVar8;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  CTestGen9Resource_Test1DLinearResource_Test *local_40;
  undefined8 *local_38;
  
  local_68 = 0;
  uStack_b0 = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_78 = 0;
  uStack_70 = 0;
  local_88 = 0;
  uStack_80 = 0;
  uStack_90 = 0;
  local_a8 = 0;
  uStack_a0 = 0;
  local_c8 = 1;
  uStack_60 = 0x100000000;
  uStack_c0 = 0x400000000;
  local_b8 = 0x80000;
  uVar8 = 0;
  puVar7 = &DAT_001acf68;
  puVar5 = &DAT_001ad00c;
  local_40 = this;
  do {
    uVar2 = 0;
    if (uVar8 < 5) {
      uVar2 = *puVar5;
    }
    local_c8 = CONCAT44(uVar2,(undefined4)local_c8);
    local_98 = 1;
    uStack_90 = CONCAT44(uStack_90._4_4_,1);
    pGVar4 = (GMM_RESOURCE_INFO *)
             (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0xe8))
                       (CommonULT::pGmmULTClientContext,&local_c8);
    pCVar1 = local_40;
    if (uVar8 < 5) {
      iVar6 = (int)*puVar7;
    }
    else {
      iVar6 = 0;
    }
    uVar3 = (int)local_98 + 0x3f;
    local_38 = puVar7;
    CTestResource::VerifyResourceHAlign<true>((CTestResource *)local_40,pGVar4,0x40);
    CTestResource::VerifyResourceSize<true>
              ((CTestResource *)pCVar1,pGVar4,
               (ulong)(iVar6 * (uVar3 & 0xffffffc0) + 0xfff & 0xfffff000));
    (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0x100))
              (CommonULT::pGmmULTClientContext,pGVar4);
    uVar8 = uVar8 + 1;
    puVar7 = local_38 + 1;
    puVar5 = puVar5 + 1;
  } while (uVar8 != 5);
  uVar8 = 0;
  puVar7 = &DAT_001acf68;
  puVar5 = &DAT_001ad00c;
  do {
    uVar2 = 0;
    if (uVar8 < 5) {
      uVar2 = *puVar5;
    }
    local_c8 = CONCAT44(uVar2,(undefined4)local_c8);
    local_98 = 0x1001;
    uStack_90 = CONCAT44(uStack_90._4_4_,1);
    pGVar4 = (GMM_RESOURCE_INFO *)
             (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0xe8))
                       (CommonULT::pGmmULTClientContext,&local_c8);
    pCVar1 = local_40;
    if (uVar8 < 5) {
      iVar6 = (int)*puVar7;
    }
    else {
      iVar6 = 0;
    }
    uVar3 = (int)local_98 + 0x3f;
    local_38 = puVar7;
    CTestResource::VerifyResourceHAlign<true>((CTestResource *)local_40,pGVar4,0x40);
    CTestResource::VerifyResourceSize<true>
              ((CTestResource *)pCVar1,pGVar4,
               (ulong)(iVar6 * (uVar3 & 0xffffffc0) + 0xfff & 0xfffff000));
    (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0x100))
              (CommonULT::pGmmULTClientContext,pGVar4);
    uVar8 = uVar8 + 1;
    puVar7 = local_38 + 1;
    puVar5 = puVar5 + 1;
  } while (uVar8 != 5);
  return;
}

Assistant:

TEST_F(CTestGen9Resource, Test1DLinearResource)
{
    // Horizontal pixel alignment
    const uint32_t HAlign = 64;

    GMM_RESCREATE_PARAMS gmmParams = {};
    gmmParams.Type                 = RESOURCE_1D;
    gmmParams.NoGfxMemory          = 1;
    gmmParams.Flags.Info.Linear    = 1;
    gmmParams.Flags.Gpu.Texture    = 1;

    // Allocate 1x1 surface
    for(uint32_t i = 0; i < TEST_BPP_MAX; i++)
    {
        TEST_BPP bpp          = static_cast<TEST_BPP>(i);
        gmmParams.Format      = SetResourceFormat(bpp);
        gmmParams.BaseWidth64 = 0x1;
        gmmParams.BaseHeight  = 1;

        GMM_RESOURCE_INFO *ResourceInfo;
        ResourceInfo = pGmmULTClientContext->CreateResInfoObject(&gmmParams);

        uint32_t AlignedWidth = GMM_ULT_ALIGN(gmmParams.BaseWidth64, HAlign);
        uint32_t PitchInBytes = AlignedWidth * GetBppValue(bpp);
        uint32_t AlignedSize  = GMM_ULT_ALIGN(PitchInBytes, PAGE_SIZE);

        VerifyResourceHAlign<true>(ResourceInfo, HAlign);
        VerifyResourceVAlign<false>(ResourceInfo, 0);       // N/A for 1D
        VerifyResourcePitch<false>(ResourceInfo, 0);        // N/A for 1D
        VerifyResourcePitchInTiles<false>(ResourceInfo, 0); // N/A for linear
        VerifyResourceSize<true>(ResourceInfo, AlignedSize);
        VerifyResourceQPitch<false>(ResourceInfo, 0); // N/A for non-arrayed

        pGmmULTClientContext->DestroyResInfoObject(ResourceInfo);
    }


    // Allocate more than 1 page
    for(uint32_t i = 0; i < TEST_BPP_MAX; i++)
    {
        TEST_BPP bpp          = static_cast<TEST_BPP>(i);
        gmmParams.Format      = SetResourceFormat(bpp);
        gmmParams.BaseWidth64 = 0x1001;
        gmmParams.BaseHeight  = 1;

        GMM_RESOURCE_INFO *ResourceInfo;
        ResourceInfo = pGmmULTClientContext->CreateResInfoObject(&gmmParams);

        uint32_t AlignedWidth = GMM_ULT_ALIGN(gmmParams.BaseWidth64, HAlign);
        uint32_t PitchInBytes = AlignedWidth * GetBppValue(bpp);
        uint32_t AlignedSize  = GMM_ULT_ALIGN(PitchInBytes, PAGE_SIZE);

        VerifyResourceHAlign<true>(ResourceInfo, HAlign);
        VerifyResourceVAlign<false>(ResourceInfo, 0);       // N/A for 1D
        VerifyResourcePitch<false>(ResourceInfo, 0);        // N/A for 1D
        VerifyResourcePitchInTiles<false>(ResourceInfo, 0); // N/A for linear
        VerifyResourceSize<true>(ResourceInfo, AlignedSize);
        VerifyResourceQPitch<false>(ResourceInfo, 0); // N/A for non-arrayed

        pGmmULTClientContext->DestroyResInfoObject(ResourceInfo);
    }
}